

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb *pRB)

{
  int iVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_14;
  
  if (in_RDI == 0) {
    local_14 = 0;
  }
  else {
    mVar2 = ma_rb_available_write
                      ((ma_rb *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar1 = *(int *)(in_RDI + 0x8c);
    mVar3 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
    local_14 = mVar2 / (mVar3 * iVar1);
  }
  return local_14;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_available_write(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}